

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O1

BOOL __thiscall
Js::JavascriptArray::GetDiagValueString
          (JavascriptArray *this,StringBuilder<Memory::ArenaAllocator> *stringBuilder,
          ScriptContext *requestContext)

{
  charcount_t cVar1;
  JavascriptString *pJVar2;
  char16 *pcVar3;
  void *unaff_retaddr;
  JavascriptString *pJStack_98;
  JavascriptString *valueStr;
  void *local_88;
  void *pvStack_80;
  ScriptContext *local_78;
  ScriptEntryExitRecord *pSStack_70;
  ExceptionType local_68;
  undefined4 uStack_64;
  undefined1 local_58 [8];
  EnterScriptObject __enterScriptObject;
  JavascriptString *valueStr_1;
  
  StringBuilder<Memory::ArenaAllocator>::Append(stringBuilder,L'[');
  if ((this->super_ArrayObject).length < 10) {
    if (requestContext->threadContext->isScriptActive == false) {
      local_78 = (ScriptContext *)0x0;
      pSStack_70 = (ScriptEntryExitRecord *)0x0;
      local_88 = (void *)0x0;
      pvStack_80 = (void *)0x0;
      pJStack_98 = (JavascriptString *)0x0;
      valueStr = (JavascriptString *)0x0;
      local_68 = ExceptionType_None;
      uStack_64 = 0;
      EnterScriptObject::EnterScriptObject
                ((EnterScriptObject *)local_58,requestContext,
                 (ScriptEntryExitRecord *)&stack0xffffffffffffff68,unaff_retaddr,&stack0x00000000,
                 true,false,false);
      ScriptContext::OnScriptStart(requestContext,false,true);
      EnterScriptObject::VerifyEnterScript((EnterScriptObject *)local_58);
      EnterPinnedScope(&__enterScriptObject.library);
      pJVar2 = StringCache::GetCommaDisplay
                         (&((((this->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
                              type.ptr)->javascriptLibrary).ptr)->stringCache);
      __enterScriptObject.library = (JavascriptLibrary *)JoinHelper(this,pJVar2,requestContext);
      pcVar3 = JavascriptString::GetString((JavascriptString *)__enterScriptObject.library);
      cVar1 = JavascriptString::GetLength((JavascriptString *)__enterScriptObject.library);
      StringBuilder<Memory::ArenaAllocator>::EnsureBuffer(stringBuilder,cVar1);
      JavascriptString::CopyHelper(stringBuilder->appendPtr,pcVar3,cVar1);
      stringBuilder->appendPtr = stringBuilder->appendPtr + cVar1;
      stringBuilder->count = stringBuilder->count + cVar1;
      LeavePinnedScope();
      EnterScriptObject::~EnterScriptObject((EnterScriptObject *)local_58);
    }
    else {
      EnterPinnedScope(&stack0xffffffffffffff68);
      pJVar2 = StringCache::GetCommaDisplay
                         (&((((this->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
                              type.ptr)->javascriptLibrary).ptr)->stringCache);
      pJStack_98 = JoinHelper(this,pJVar2,requestContext);
      pcVar3 = JavascriptString::GetString(pJStack_98);
      cVar1 = JavascriptString::GetLength(pJStack_98);
      StringBuilder<Memory::ArenaAllocator>::EnsureBuffer(stringBuilder,cVar1);
      JavascriptString::CopyHelper(stringBuilder->appendPtr,pcVar3,cVar1);
      stringBuilder->appendPtr = stringBuilder->appendPtr + cVar1;
      stringBuilder->count = stringBuilder->count + cVar1;
      LeavePinnedScope();
    }
  }
  else {
    StringBuilder<Memory::ArenaAllocator>::AppendCppLiteral<4ul>
              (stringBuilder,(char16 (*) [4])0x10cb430);
  }
  StringBuilder<Memory::ArenaAllocator>::Append(stringBuilder,L']');
  return 1;
}

Assistant:

BOOL JavascriptArray::GetDiagValueString(StringBuilder<ArenaAllocator>* stringBuilder, ScriptContext* requestContext)
    {
        stringBuilder->Append(_u('['));

        if (this->length < 10)
        {
            auto funcPtr = [&]()
            {
                ENTER_PINNED_SCOPE(JavascriptString, valueStr);
                valueStr = JavascriptArray::JoinHelper(this, GetLibrary()->GetCommaDisplayString(), requestContext);
                stringBuilder->Append(valueStr->GetString(), valueStr->GetLength());
                LEAVE_PINNED_SCOPE();
            };

            if (!requestContext->GetThreadContext()->IsScriptActive())
            {
                BEGIN_JS_RUNTIME_CALL(requestContext);
                {
                    funcPtr();
                }
                END_JS_RUNTIME_CALL(requestContext);
            }
            else
            {
                funcPtr();
            }
        }
        else
        {
            stringBuilder->AppendCppLiteral(_u("..."));
        }

        stringBuilder->Append(_u(']'));

        return TRUE;
    }